

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O3

err_t bign96Sign(octet *sig,bign_params *params,octet *oid_der,size_t oid_len,octet *hash,
                octet *privkey,gen_i rng,void *rng_state)

{
  word *a;
  word *b;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  u64 *dest;
  word *stack;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    eVar2 = 0x1f6;
    if (((params->l == 0x60) && (eVar2 = 0x12d, oid_len != 0xffffffffffffffff)) &&
       (sVar4 = oidFromDER((char *)0x0,oid_der,oid_len), sVar4 != 0xffffffffffffffff)) {
      if (rng == (gen_i)0x0) {
        eVar2 = 0x130;
      }
      else {
        sVar4 = bign96Start_keep(bign96Sign_deep);
        ec = (ec_o *)blobCreate(sVar4);
        if (ec == (ec_o *)0x0) {
          eVar2 = 0x6e;
        }
        else {
          eVar2 = bign96Start(ec,params);
          if (eVar2 == 0) {
            sVar4 = ec->f->n;
            bVar1 = memIsValid(hash,0x18);
            eVar2 = 0x6d;
            if (((bVar1 != 0) && (bVar1 = memIsValid(privkey,0x18), bVar1 != 0)) &&
               ((bVar1 = memIsValid(sig,0x22), bVar1 != 0 &&
                (bVar1 = memIsDisjoint2(hash,0x18,sig,0x22), bVar1 != 0)))) {
              dest = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
              u64From(dest,privkey,0x18);
              bVar1 = wwIsZero(dest,sVar4);
              eVar2 = 0x1f8;
              if ((bVar1 == 0) && (iVar3 = wwCmp(dest,ec->order,sVar4), iVar3 < 0)) {
                a = dest + sVar4;
                bVar1 = zzRandNZMod(a,ec->order,sVar4,rng,rng_state);
                if (bVar1 == 0) {
                  eVar2 = 0x130;
                }
                else {
                  b = a + sVar4;
                  stack = b + sVar4 + 4;
                  bVar1 = ecMulA(b,ec->base,ec,a,sVar4,stack);
                  if (bVar1 == 0) {
                    eVar2 = 0x1f6;
                  }
                  else {
                    (*ec->f->to)((octet *)b,b,ec->f,stack);
                    beltHashStart(stack);
                    beltHashStepH(oid_der,oid_len,stack);
                    beltHashStepH(b,0x18,stack);
                    beltHashStepH(hash,0x18,stack);
                    beltHashStepG2(sig,10,stack);
                    sig[10] = '\0';
                    sig[0xb] = '\0';
                    sig[0xc] = 0x80;
                    u64From(b + sVar4 + 2,sig,0xd);
                    zzMul(b,b + sVar4 + 2,2,dest,sVar4,stack);
                    zzMod(dest,b,sVar4 + 2,ec->order,sVar4,stack);
                    zzSubMod(dest,a,dest,ec->order,sVar4);
                    u64From(a,hash,0x18);
                    zzSubMod(dest,dest,a,ec->order,sVar4);
                    u64To(sig + 10,0x18,dest);
                    eVar2 = 0;
                  }
                }
              }
            }
          }
          blobClose(ec);
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bign96Sign(octet sig[34], const bign_params* params,
	const octet oid_der[], size_t oid_len, const octet hash[24],
	const octet privkey[24], gen_i rng, void* rng_state)
{
	err_t code;
	size_t n;
	// состояние (буферы могут пересекаться)
	void* state;			
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* k;				/* [n] одноразовый личный ключ */
	word* R;				/* [2n] точка R */
	word* s0;				/* [W_OF_O(13)] первая часть подписи */
	word* s1;				/* [n] вторая часть подписи */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len) == SIZE_MAX)
		return ERR_BAD_OID;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96Sign_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(hash, 24) ||
		!memIsValid(privkey, 24) ||
		!memIsValid(sig, 34) ||
		!memIsDisjoint2(hash, 24, sig, 34))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = s1 = objEnd(ec, word);
	k = d + n;
	R = k + n;
	s0 = R + n + W_OF_O(13);
	stack = (octet*)(s0 + W_OF_O(13));
	// загрузить d
	wwFrom(d, privkey, 24);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// сгенерировать k с помощью rng
	if (!zzRandNZMod(k, ec->order, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// R <- k G
	if (!ecMulA(R, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 <- belt-hash(oid || R || H) mod 2^80 + 2^l
	beltHashStart(stack);
	beltHashStepH(oid_der, oid_len, stack);
	beltHashStepH(R, 24, stack);
	beltHashStepH(hash, 24, stack);
	beltHashStepG2(sig, 10, stack);
	sig[10] = sig[11] = 0, sig[12] = 0x80;
	wwFrom(s0, sig, 13);
	// R <- (s0 + 2^l) d
	zzMul(R, s0, W_OF_O(13), d, n, stack);
	// s1 <- R mod q
	zzMod(s1, R, n + W_OF_O(13), ec->order, n, stack);
	// s1 <- (k - s1 - H) mod q
	zzSubMod(s1, k, s1, ec->order, n);
	wwFrom(k, hash, 24);
	zzSubMod(s1, s1, k, ec->order, n);
	// выгрузить s1
	wwTo(sig + 10, 24, s1);
	// все нормально
	blobClose(state);
	return ERR_OK;
}